

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintStamp.cpp
# Opt level: O2

void __thiscall OpenMD::RestraintStamp::~RestraintStamp(RestraintStamp *this)

{
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__RestraintStamp_0021d590;
  ParameterBase::~ParameterBase(&(this->Print).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->RestrainedSwingYAngle).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->RestrainedSwingXAngle).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->RestrainedTwistAngle).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->AbsolutePositionZ).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->SwingYSpringConstant).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->SwingXSpringConstant).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->TwistSpringConstant).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->AbsoluteSpringConstant).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->DisplacementSpringConstant).super_ParameterBase);
  ParameterBase::~ParameterBase(&(this->MolIndex).super_ParameterBase);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->ObjectSelection);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter(&this->Type);
  DataHolder::~DataHolder(&this->super_DataHolder);
  return;
}

Assistant:

RestraintStamp::~RestraintStamp() {}